

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_statement.cpp
# Opt level: O1

void __thiscall cpp_db::sqlite_statement::execute(sqlite_statement *this)

{
  int iVar1;
  runtime_error *this_00;
  sqlite_exception *this_01;
  sqlite3 *db;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = (*(this->super_statement_interface)._vptr_statement_interface[3])();
  if ((char)iVar1 == '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Statement not prepared!","")
    ;
    std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_00116820;
    __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = sqlite3_step((this->stmt).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  if (iVar1 != 0) {
    if (0xfffffffd < iVar1 - 0x66U) {
      (*(this->super_statement_interface)._vptr_statement_interface[7])(this);
      return;
    }
    this_01 = (sqlite_exception *)__cxa_allocate_exception(0x18);
    db = get_db_handle(this);
    sqlite_exception::sqlite_exception(this_01,iVar1,db);
    __cxa_throw(this_01,&sqlite_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void sqlite_statement::execute()
{
    if (!is_prepared())
        throw db_exception("Statement not prepared!");

    if (int error_code = sqlite3_step(stmt.get()))
    {
        if (error_code != SQLITE_DONE && error_code != SQLITE_ROW)
            throw sqlite_exception(error_code, get_db_handle());
        else
            reset();
    }
}